

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

double __thiscall
ParserProbModelXML::QueryTable
          (ParserProbModelXML *this,xmlNodePtr node,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          *t0_deps,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *t1_deps)

{
  string *__return_storage_ptr__;
  pointer pdVar1;
  _Rep_type *p_Var2;
  int iVar3;
  Index IVar4;
  xmlNodePtr pxVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  const_iterator cVar7;
  long *plVar8;
  ostream *poVar9;
  EParse *pEVar10;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ParserProbModelXML *pPVar13;
  ParserProbModelXML *pPVar14;
  char *this_00;
  FactoredDecPOMDPDiscrete *this_01;
  double dVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> factor_sizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> factor_values;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *local_268;
  xmlNodePtr local_260;
  string local_258;
  undefined1 local_238 [32];
  string local_218;
  undefined1 local_1f8 [64];
  undefined1 local_1b8 [16];
  pointer local_1a8 [47];
  
  pPVar14 = (ParserProbModelXML *)local_1f8;
  local_268 = &t0_deps->_M_t;
  local_1f8._0_8_ = local_1f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"Values","");
  pPVar13 = (ParserProbModelXML *)node;
  pxVar5 = FindChild(pPVar14,node,(string *)local_1f8);
  if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
    pPVar13 = (ParserProbModelXML *)(local_1f8._16_8_ + 1);
    operator_delete((void *)local_1f8._0_8_,(ulong)pPVar13);
  }
  if (pxVar5 == (xmlNodePtr)0x0) {
    pEVar10 = (EParse *)__cxa_allocate_exception(0x28);
    GetVariableName_abi_cxx11_(&local_2c8,pPVar13,node);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1f8 + 0x40),"Variable ",&local_2c8);
    plVar8 = (long *)std::__cxx11::string::append(local_1f8 + 0x40);
    local_218._M_dataplus._M_p = (pointer)*plVar8;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == paVar12) {
      local_218.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_218.field_2._8_8_ = plVar8[3];
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    }
    else {
      local_218.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_218._M_string_length = plVar8[1];
    *plVar8 = (long)paVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    EParse::EParse(pEVar10,&local_218);
    __cxa_throw(pEVar10,&EParse::typeinfo,E::~E);
  }
  pvVar6 = ParseArray(this,pxVar5);
  pdVar1 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar1 == 8) {
    dVar15 = *pdVar1;
  }
  else {
    pPVar13 = (ParserProbModelXML *)local_238;
    local_238._0_8_ = (ParserProbModelXML *)(local_238 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Variables","");
    pxVar5 = FindChild(pPVar13,node,(string *)local_238);
    pPVar13 = (ParserProbModelXML *)xmlLastElementChild(pxVar5);
    this_01 = (FactoredDecPOMDPDiscrete *)local_238._0_8_;
    local_260 = node;
    if ((ParserProbModelXML *)local_238._0_8_ != (ParserProbModelXML *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    if (pPVar13 != (ParserProbModelXML *)0x0) {
      p_Var2 = (_Rep_type *)&local_268->_M_impl;
      __return_storage_ptr__ = (string *)(local_1f8 + 0x40);
      do {
        if (*(int *)&pPVar13->_m_context == 1) {
          pPVar14 = pPVar13;
          iVar3 = GetVariableTimeslice((ParserProbModelXML *)this_01,(xmlNodePtr)pPVar13);
          GetVariableName_abi_cxx11_(__return_storage_ptr__,pPVar14,(xmlNodePtr)pPVar13);
          if (iVar3 == 0) {
            cVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    ::find(local_268,__return_storage_ptr__);
          }
          else {
            cVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    ::find(&t1_deps->_M_t,__return_storage_ptr__);
          }
          if (((_Rb_tree_header *)cVar7._M_node == &(p_Var2->_M_impl).super__Rb_tree_header) ||
             ((_Rb_tree_header *)cVar7._M_node == &(t1_deps->_M_t)._M_impl.super__Rb_tree_header)) {
            pEVar10 = (EParse *)__cxa_allocate_exception(0x28);
            std::operator+(&local_2c8,"Requested variable \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_1f8 + 0x40));
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c8);
            local_258._M_dataplus._M_p = (pointer)*plVar8;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_258._M_dataplus._M_p == psVar11) {
              local_258.field_2._M_allocated_capacity = *psVar11;
              local_258.field_2._8_8_ = plVar8[3];
              local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            }
            else {
              local_258.field_2._M_allocated_capacity = *psVar11;
            }
            local_258._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            EParse::EParse(pEVar10,&local_258);
            __cxa_throw(pEVar10,&EParse::typeinfo,E::~E);
          }
          if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_288,
                       (iterator)
                       local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&cVar7._M_node[2]._M_color);
          }
          else {
            *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = cVar7._M_node[2]._M_color;
            local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_2c8._M_dataplus._M_p = (pointer)(ulong)*(uint *)&cVar7._M_node[2].field_0x4;
          if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_2a8,
                       (iterator)
                       local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_2c8);
          }
          else {
            *local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_2c8._M_dataplus._M_p;
            local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          this_01 = (FactoredDecPOMDPDiscrete *)local_1b8._0_8_;
          if ((FactoredDecPOMDPDiscrete *)local_1b8._0_8_ !=
              (FactoredDecPOMDPDiscrete *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_,
                            (ulong)((long)&(local_1a8[0]->super_SDT).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + 1));
          }
        }
        pPVar13 = (ParserProbModelXML *)
                  (pPVar13->_m_parsedElements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
        ;
      } while (pPVar13 != (ParserProbModelXML *)0x0);
    }
    IVar4 = IndexTools::IndividualToJointIndices(&local_288,&local_2a8);
    pdVar1 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= (ulong)IVar4) {
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1f8 + 0x40));
      this_00 = "CPD indexed value for variable ";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"CPD indexed value for variable ",0x1f);
      GetVariableName_abi_cxx11_(&local_2c8,(ParserProbModelXML *)this_00,local_260);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b8 + 0x10),local_2c8._M_dataplus._M_p,
                          local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," out of bounds",0xe);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      pEVar10 = (EParse *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      EParse::EParse(pEVar10,(string *)(local_1f8 + 0x20));
      __cxa_throw(pEVar10,&EParse::typeinfo,E::~E);
    }
    dVar15 = pdVar1[IVar4];
    if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_288.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return dVar15;
}

Assistant:

double ParserProbModelXML::QueryTable(const xmlNodePtr node,
                                      const std::map<std::string, std::pair<Index, Index> > t0_deps, 
                                      const std::map<std::string, std::pair<Index, Index> > t1_deps)
{
    xmlNodePtr data_node = FindChild(node, "Values");
    if(data_node == NULL)
        throw EParse("Variable " + GetVariableName(node) + " has an empty CPD");
    const vector<double>* data = ParseArray(data_node);

    if(data->size() == 1) //typically the case for rewards in ADDs
        return data->at(0);

    xmlNodePtr current = xmlLastElementChild(FindChild(node, "Variables"));
    vector<Index> factor_values;
    vector<size_t> factor_sizes;
    map<string, pair<Index, Index> >::const_iterator it;
        
    for(Index i = 0; current != NULL;)
    {
        if(current->type == XML_ELEMENT_NODE)
        {
            int timeslice = GetVariableTimeslice(current);
            string name = GetVariableName(current);
            if(timeslice == 0)
            {
                it = t0_deps.find(name);
            }
            else
            {
                it = t1_deps.find(name);
            }
            if(it == t0_deps.end() || it == t1_deps.end())
            {
              throw EParse("Requested variable \"" + name + "\" which is not present in the dependencies of this CPT.");
            }
            factor_values.push_back(it->second.first);
            factor_sizes.push_back(it->second.second);
            i++;
        }
        current = current->prev;
    }

    Index jIdx = IndexTools::IndividualToJointIndices(factor_values, factor_sizes);

    if(jIdx < data->size())
    {
      return data->at(jIdx);
    }
    else
    {
      stringstream ss;
      ss << "CPD indexed value for variable " << GetVariableName(node) << " out of bounds";
      throw EParse(ss.str());
    }
}